

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_map_custom2_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_custom2_op_t fun,int n_tasks,
          void *userdata,_Bool inplace)

{
  ggml_tensor *tensor;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  byte in_stack_00000008;
  ggml_map_custom2_op_params params;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffff98;
  ggml_context *in_stack_ffffffffffffffa0;
  ggml_tensor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  if ((in_R8D != -1) && (in_R8D < 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x134f,"GGML_ASSERT(%s) failed","n_tasks == GGML_N_TASKS_MAX || n_tasks > 0");
  }
  if ((in_stack_00000008 & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
  }
  ggml_set_op_params(tensor,in_stack_ffffffffffffff98,0x153ba6);
  tensor->op = GGML_OP_MAP_CUSTOM2;
  tensor->src[0] = in_RSI;
  tensor->src[1] = in_RDX;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_map_custom2_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        struct ggml_tensor       * b,
        const  ggml_custom2_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom2_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM2;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}